

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_uqadd_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  uintptr_t i;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  
  uVar2 = (desc & 0x1f) * 8 + 8;
  uVar4 = (ulong)uVar2;
  bVar6 = false;
  for (uVar5 = 0; uVar2 >> 3 != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = *(ulong *)((long)vm + uVar5 * 8);
    puVar1 = (ulong *)((long)vn + uVar5 * 8);
    bVar8 = CARRY8(uVar3,*puVar1);
    lVar7 = uVar3 + *puVar1;
    if (bVar8) {
      lVar7 = -1;
    }
    bVar6 = (bool)(bVar6 | bVar8);
    *(long *)((long)vd + uVar5 * 8) = lVar7;
  }
  if (bVar6) {
    *(undefined4 *)vq = 1;
  }
  for (; uVar4 < (desc >> 2 & 0xf8) + 8; uVar4 = uVar4 + 8) {
    *(undefined8 *)((long)vd + uVar4) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_uqadd_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        uint64_t nn = n[i], mm = m[i], dd = nn + mm;
        if (dd < nn) {
            dd = UINT64_MAX;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}